

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

idx_t __thiscall
duckdb::TaskScheduler::GetTaskCountForProducer(TaskScheduler *this,ProducerToken *token)

{
  ConcurrentQueueProducerTypelessBase *pCVar1;
  ConcurrentQueueProducerTypelessBase *pCVar2;
  long lVar3;
  pointer pQVar4;
  idx_t iVar5;
  
  ::std::mutex::lock(&token->producer_lock);
  unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>::
  operator->(&this->queue);
  pQVar4 = unique_ptr<duckdb::QueueProducerToken,_std::default_delete<duckdb::QueueProducerToken>,_true>
           ::operator->(&token->token);
  pCVar1 = (pQVar4->queue_token).producer;
  pCVar2 = pCVar1[1].next;
  lVar3 = *(long *)&pCVar1[1].inactive;
  iVar5 = 0;
  if (0x8000000000000000 < (ulong)(lVar3 - (long)pCVar2)) {
    iVar5 = (long)pCVar2 - lVar3;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&token->producer_lock);
  return iVar5;
}

Assistant:

idx_t TaskScheduler::GetTaskCountForProducer(ProducerToken &token) const {
#ifndef DUCKDB_NO_THREADS
	lock_guard<mutex> producer_lock(token.producer_lock);
	return queue->q.size_producer_approx(token.token->queue_token);
#else
	const auto it = queue->q.find(std::ref(*token.token));
	if (it == queue->q.end()) {
		return 0;
	}
	return it->second.size();
#endif
}